

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void eye_scale(double *mat,int N,double lambda)

{
  int local_28;
  int t;
  int j;
  int i;
  double lambda_local;
  int N_local;
  double *mat_local;
  
  for (t = 0; t < N; t = t + 1) {
    for (local_28 = 0; local_28 < N; local_28 = local_28 + 1) {
      if (t == local_28) {
        mat[t * N + local_28] = lambda;
      }
      else {
        mat[t * N + local_28] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void eye_scale(double *mat, int N, double lambda) {
	int i, j, t;
	for (i = 0; i < N; ++i) {
		for (j = 0; j < N; ++j) {
			t = i*N;
			if (i == j) {
				mat[t + j] = lambda;
			}
			else {
				mat[t + j] = 0.;
			}
		}

	}
}